

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall
FpgaIO::PromWriteBlock25AA128(FpgaIO *this,uint16_t addr,quadlet_t *data,uint nquads,uchar chan)

{
  int iVar1;
  nodeaddr_t nVar2;
  nodeaddr_t nVar3;
  undefined6 in_register_00000032;
  BasePort *pBVar4;
  PromType type;
  
  if (nquads - 0x11 < 0xfffffff0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"invalid number of quadlets",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  else {
    type = PROM_25AA128_1;
    if (chan != '\x01') {
      type = (uint)(chan == '\x02') * 2 + PROM_25AA128;
    }
    nVar2 = GetPromAddress(this,type,true);
    pBVar4 = (this->super_BoardIO).port;
    iVar1 = (*pBVar4->_vptr_BasePort[0x27])
                      (pBVar4,(ulong)(this->super_BoardIO).BoardId,nVar2 | 0x100,data,
                       (ulong)(nquads * 4));
    if ((char)iVar1 != '\0') {
      nVar3 = GetPromAddress((FpgaIO *)pBVar4,type,true);
      pBVar4 = (this->super_BoardIO).port;
      (*pBVar4->_vptr_BasePort[0x24])(pBVar4,(ulong)(this->super_BoardIO).BoardId,nVar3,0x6000000);
      pBVar4 = (this->super_BoardIO).port;
      iVar1 = (*pBVar4->_vptr_BasePort[0x24])
                        (pBVar4,(ulong)(this->super_BoardIO).BoardId,nVar2,
                         (ulong)(nquads - 1 | (int)CONCAT62(in_register_00000032,addr) << 8 |
                                0xff000000));
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

bool FpgaIO::PromWriteBlock25AA128(uint16_t addr, quadlet_t *data, unsigned int nquads,
                                   unsigned char chan)
{
    // address sanity check
    if (nquads == 0 || nquads > 16) {
        std::cout << "invalid number of quadlets" << std::endl;
        return false;
    }

    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;
    nodeaddr_t address = GetPromAddress(prom_type, true);

    // block write data to buffer
    if (!port->WriteBlock(BoardId, (address|0x0100), data, nquads*sizeof(quadlet_t)))
        return false;

    // enable write
    PromWriteEnable(prom_type);

    // trigger write
    quadlet_t write_data = 0xFF000000|(addr << 8)|(nquads-1);
    return port->WriteQuadlet(BoardId, address, write_data);
}